

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O3

void dumpString(DumpState *D,TString *ts)

{
  byte bVar1;
  int iVar2;
  char **ppcVar3;
  TString *x_;
  TString *pTVar4;
  undefined1 *puVar5;
  TValue idx;
  TValue value;
  TValue key;
  Value local_50 [2];
  Value local_40;
  undefined1 local_38;
  Value local_30;
  byte local_28;
  
  if (ts != (TString *)0x0) {
    bVar1 = luaH_getstr(D->h,ts,(TValue *)local_50);
    if ((bVar1 & 0xf) == 0) {
      pTVar4 = (TString *)(long)ts->shrlen;
      if ((long)pTVar4 < 0) {
        pTVar4 = (ts->u).hnext;
        ppcVar3 = (char **)ts->contents;
      }
      else {
        ppcVar3 = &ts->contents;
      }
      dumpVarint(D,(size_t)((long)&pTVar4->next + 2));
      if (D->status == 0) {
        puVar5 = (undefined1 *)((long)&pTVar4->next + 1);
        iVar2 = (*D->writer)(D->L,ppcVar3,(size_t)puVar5,D->data);
        D->status = iVar2;
        D->offset = (size_t)(puVar5 + D->offset);
      }
      local_40.gc = (GCObject *)(D->nstr + 1);
      D->nstr = (lua_Integer)local_40;
      local_28 = ts->tt | 0x40;
      local_38 = 3;
      local_30 = (Value)ts;
      luaH_set(D->L,D->h,(TValue *)&local_30,(TValue *)&local_40);
    }
    else {
      dumpVarint(D,1);
      dumpVarint(D,local_50[0].i);
    }
    return;
  }
  dumpVarint(D,0);
  return;
}

Assistant:

static void dumpString (DumpState *D, TString *ts) {
  if (ts == NULL)
    dumpSize(D, 0);
  else {
    TValue idx;
    int tag = luaH_getstr(D->h, ts, &idx);
    if (!tagisempty(tag)) {  /* string already saved? */
      dumpSize(D, 1);  /* reuse a saved string */
      dumpSize(D, cast_sizet(ivalue(&idx)));  /* index of saved string */
    }
    else {  /* must write and save the string */
      TValue key, value;  /* to save the string in the hash */
      size_t size;
      const char *s = getlstr(ts, size);
      dumpSize(D, size + 2);
      dumpVector(D, s, size + 1);  /* include ending '\0' */
      D->nstr++;  /* one more saved string */
      setsvalue(D->L, &key, ts);  /* the string is the key */
      setivalue(&value, D->nstr);  /* its index is the value */
      luaH_set(D->L, D->h, &key, &value);  /* h[ts] = nstr */
      /* integer value does not need barrier */
    }
  }
}